

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O2

char * TEST_parse_same_option_twice_with_unique(void)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  int i;
  cargo_t cargo;
  int j;
  char *args [7];
  
  iVar1 = cargo_init(&cargo,0,"program");
  if (iVar1 == 0) {
    args[6] = "2";
    args[4] = "4";
    args[5] = "--alpha";
    args[2] = "1";
    args[3] = "--beta";
    args[0]._0_4_ = 0x127be1;
    args[0]._4_4_ = 0;
    args[1]._0_4_ = 0x124e63;
    args[1]._4_4_ = 0;
    iVar1 = cargo_add_option(cargo,CARGO_OPT_UNIQUE,"--alpha -a","The alpha","i",&i);
    iVar2 = cargo_add_option(cargo,0,"--beta -b","The beta","i",&j);
    if (iVar2 == 0 && iVar1 == 0) {
      iVar1 = cargo_parse(cargo,0,1,7,args);
      printf("--alpha == %d\n",(ulong)(uint)i);
      if (iVar1 == 0) {
        pcVar3 = "Succesfully parsed duplicate option";
      }
      else {
        pcVar3 = (char *)0x0;
        if (i != 1) {
          pcVar3 = "Expected --alpha to have value 1";
        }
      }
    }
    else {
      pcVar3 = "Failed to add options";
    }
    cargo_destroy(&cargo);
  }
  else {
    pcVar3 = "Failed to init cargo";
  }
  return pcVar3;
}

Assistant:

_TEST_START(TEST_parse_same_option_twice_with_unique)
{
    int i;
    int j;
    char *args[] = { "program", "--alpha", "1", "--beta", "4", "--alpha", "2" };

    ret |= cargo_add_option(cargo, CARGO_OPT_UNIQUE,
                                "--alpha -a", "The alpha", "i", &i);
    ret |= cargo_add_option(cargo, 0, "--beta -b", "The beta", "i", &j);
    cargo_assert(ret == 0, "Failed to add options");

    ret = cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args);
    printf("--alpha == %d\n", i);
    cargo_assert(ret != 0, "Succesfully parsed duplicate option");
    cargo_assert(i == 1, "Expected --alpha to have value 1");

    _TEST_CLEANUP();
}